

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_things.cpp
# Opt level: O2

int P_Thing_Warp(AActor *caller,AActor *reference,double xofs,double yofs,double zofs,DAngle *angle,
                int flags,double heightoffset,double radiusoffset,DAngle *pitch)

{
  FDisplacement *pFVar1;
  int iVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  int iVar5;
  AActor *pAVar6;
  AActor *this;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double z;
  double dVar14;
  DVector3 local_78;
  DVector3 local_58;
  DAngle local_40;
  DAngle local_38;
  
  this = reference;
  if (((uint)flags >> 0xc & 1) == 0) {
    this = caller;
    caller = reference;
  }
  local_78.X = (this->__Pos).X;
  local_78.Y = (this->__Pos).Y;
  local_78.Z = (this->__Pos).Z;
  iVar5 = this->Sector->PortalGroup;
  dVar11 = caller->Height;
  if ((flags & 2U) == 0) {
    pAVar6 = this;
    if ((flags & 4U) == 0) {
      pAVar6 = caller;
    }
    angle->Degrees = (pAVar6->Angles).Yaw.Degrees + angle->Degrees;
  }
  z = heightoffset * dVar11 + zofs;
  dVar14 = radiusoffset * caller->radius;
  dVar11 = TAngle<double>::Sin(angle);
  dVar13 = TAngle<double>::Cos(angle);
  if (((uint)flags >> 10 & 1) == 0) {
    if ((flags & 1U) == 0) {
      dVar12 = dVar11 * yofs;
      yofs = xofs * dVar11 - yofs * dVar13;
      xofs = dVar12 + dVar13 * xofs;
    }
    dVar13 = dVar13 * dVar14 + xofs;
    dVar11 = dVar11 * dVar14 + yofs;
    if (((uint)flags >> 8 & 1) == 0) {
      AActor::Vec3Offset(&local_58,caller,dVar13,dVar11,z,false);
      AActor::SetOrigin(this,&local_58,true);
    }
    else {
      AActor::Vec3Offset(&local_58,caller,dVar13,dVar11,0.0,false);
      AActor::SetOrigin(this,&local_58,true);
LAB_004591de:
      (this->__Pos).Z = z + this->floorz;
    }
  }
  else {
    AActor::SetOrigin(this,dVar13 * dVar14 + xofs,dVar11 * dVar14 + yofs,z,true);
    if (((uint)flags >> 8 & 1) != 0) goto LAB_004591de;
  }
  if (((flags & 8U) == 0) && (bVar4 = P_TestMobjLocation(this), !bVar4)) {
    AActor::SetOrigin(this,&local_78,true);
    return 0;
  }
  if (((uint)flags >> 9 & 1) != 0) {
    AActor::SetOrigin(this,&local_78,true);
    return 1;
  }
  (this->Angles).Yaw.Degrees = angle->Degrees;
  if ((short)flags < 0) {
    local_38.Degrees = (caller->Angles).Pitch.Degrees;
    AActor::SetPitch(this,&local_38,false,false);
  }
  dVar11 = pitch->Degrees;
  if ((dVar11 != 0.0) || (NAN(dVar11))) {
    local_40.Degrees = dVar11 + (this->Angles).Pitch.Degrees;
    AActor::SetPitch(this,&local_40,false,false);
  }
  if (((uint)flags >> 0xe & 1) != 0) {
    (this->Vel).Z = (caller->Vel).Z;
    dVar11 = (caller->Vel).Y;
    (this->Vel).X = (caller->Vel).X;
    (this->Vel).Y = dVar11;
  }
  if ((char)flags < '\0') {
    (this->Vel).X = 0.0;
    (this->Vel).Y = 0.0;
    (this->Vel).Z = 0.0;
  }
  if ((flags & 0x20U) == 0) {
    if ((flags & 0x40U) == 0) {
      if ((flags & 0x10U) == 0) {
        AActor::ClearInterpolation(this);
      }
      goto LAB_00459434;
    }
    iVar5 = this->Sector->PortalGroup;
    dVar11 = 0.0;
    dVar13 = 0.0;
    uVar7 = 0;
    uVar8 = 0;
    uVar9 = 0;
    uVar10 = 0;
    if (caller->PrevPortalGroup != iVar5) {
      pFVar1 = Displacements.data.Array + (Displacements.size * iVar5 + caller->PrevPortalGroup);
      uVar7 = *(undefined4 *)&(pFVar1->pos).X;
      uVar8 = *(undefined4 *)((long)&(pFVar1->pos).X + 4);
      uVar9 = *(undefined4 *)&(pFVar1->pos).Y;
      uVar10 = *(undefined4 *)((long)&(pFVar1->pos).Y + 4);
    }
    iVar2 = caller->Sector->PortalGroup;
    if (iVar2 != iVar5) {
      dVar11 = Displacements.data.Array[Displacements.size * iVar5 + iVar2].pos.X;
      dVar13 = Displacements.data.Array[Displacements.size * iVar5 + iVar2].pos.Y;
    }
    (this->Prev).Z = ((this->__Pos).Z + local_78.Z) - local_78.Z;
    dVar11 = ((double)CONCAT44(uVar8,uVar7) + local_78.X + (this->__Pos).X) - (local_78.X + dVar11);
    dVar13 = ((double)CONCAT44(uVar10,uVar9) + local_78.Y + (this->__Pos).Y) - (local_78.Y + dVar13)
    ;
    auVar3._8_4_ = SUB84(dVar13,0);
    auVar3._0_8_ = dVar11;
    auVar3._12_4_ = (int)((ulong)dVar13 >> 0x20);
    (this->Prev).X = dVar11;
    (this->Prev).Y = (double)auVar3._8_8_;
  }
  else {
    iVar2 = this->Sector->PortalGroup;
    uVar7 = 0;
    uVar8 = 0;
    uVar9 = 0;
    uVar10 = 0;
    if (iVar5 != iVar2) {
      pFVar1 = Displacements.data.Array + (iVar2 * Displacements.size + iVar5);
      uVar7 = *(undefined4 *)&(pFVar1->pos).X;
      uVar8 = *(undefined4 *)((long)&(pFVar1->pos).X + 4);
      uVar9 = *(undefined4 *)&(pFVar1->pos).Y;
      uVar10 = *(undefined4 *)((long)&(pFVar1->pos).Y + 4);
    }
    local_58.Z = (this->__Pos).Z - local_78.Z;
    local_58.X = (this->__Pos).X - ((double)CONCAT44(uVar8,uVar7) + local_78.X);
    local_58.Y = (this->__Pos).Y - ((double)CONCAT44(uVar10,uVar9) + local_78.Y);
    TVector3<double>::operator+=(&this->Prev,&local_58);
    iVar5 = this->Sector->PortalGroup;
  }
  this->PrevPortalGroup = iVar5;
LAB_00459434:
  if ((((uint)flags >> 0xb & 1) != 0) && (((caller->flags2).Value & 0x80000) != 0)) {
    dVar11 = AActor::GetBobOffset(caller,0.0);
    (this->__Pos).Z = dVar11 + (this->__Pos).Z;
  }
  local_58.X = (this->__Pos).X;
  local_58.Y = (this->__Pos).Y;
  P_TryMove(this,(DVector2 *)&local_58,0,(secplane_t *)0x0);
  return 1;
}

Assistant:

int P_Thing_Warp(AActor *caller, AActor *reference, double xofs, double yofs, double zofs, DAngle angle, int flags, double heightoffset, double radiusoffset, DAngle pitch)
{
	if (flags & WARPF_MOVEPTR)
	{
		AActor *temp = reference;
		reference = caller;
		caller = temp;
	}

	DVector3 old = caller->Pos();
	int oldpgroup = caller->Sector->PortalGroup;

	zofs += reference->Height * heightoffset;
	

	if (!(flags & WARPF_ABSOLUTEANGLE))
	{
		angle += (flags & WARPF_USECALLERANGLE) ? caller->Angles.Yaw: reference->Angles.Yaw;
	}

	const double rad = radiusoffset * reference->radius;
	const double s = angle.Sin();
	const double c = angle.Cos();

	if (!(flags & WARPF_ABSOLUTEPOSITION))
	{
		if (!(flags & WARPF_ABSOLUTEOFFSET))
		{
			double xofs1 = xofs;

			// (borrowed from A_SpawnItemEx, assumed workable)
			// in relative mode negative y values mean 'left' and positive ones mean 'right'
			// This is the inverse orientation of the absolute mode!
			
			xofs = xofs1 * c + yofs * s;
			yofs = xofs1 * s - yofs * c;
		}

		if (flags & WARPF_TOFLOOR)
		{
			// set correct xy
			// now the caller's floorz should be appropriate for the assigned xy-position
			// assigning position again with.
			// extra unlink, link and environment calculation
			caller->SetOrigin(reference->Vec3Offset(xofs + rad * c, yofs + rad * s, 0.), true);
			// The two-step process is important.
			caller->SetZ(caller->floorz + zofs);
		}
		else
		{
			caller->SetOrigin(reference->Vec3Offset(xofs + rad * c, yofs + rad * s, zofs), true);
		}
	}
	else // [MC] The idea behind "absolute" is meant to be "absolute". Override everything, just like A_SpawnItemEx's.
	{
		caller->SetOrigin(xofs + rad * c, yofs + rad * s, zofs, true);
		if (flags & WARPF_TOFLOOR)
		{
			caller->SetZ(caller->floorz + zofs);
		}
	}

	if ((flags & WARPF_NOCHECKPOSITION) || P_TestMobjLocation(caller))
	{
		if (flags & WARPF_TESTONLY)
		{
			caller->SetOrigin(old, true);
		}
		else
		{
			caller->Angles.Yaw = angle;

			if (flags & WARPF_COPYPITCH)
				caller->SetPitch(reference->Angles.Pitch, false);
			
			if (pitch != 0)
				caller->SetPitch(caller->Angles.Pitch + pitch, false);
			
			if (flags & WARPF_COPYVELOCITY)
			{
				caller->Vel = reference->Vel;
			}
			if (flags & WARPF_STOP)
			{
				caller->Vel.Zero();
			}

			// this is no fun with line portals 
			if (flags & WARPF_WARPINTERPOLATION)
			{
				// This just translates the movement but doesn't change the vector
				DVector3 displacedold  = old + Displacements.getOffset(oldpgroup, caller->Sector->PortalGroup);
				caller->Prev += caller->Pos() - displacedold;
				caller->PrevPortalGroup = caller->Sector->PortalGroup;
			}
			else if (flags & WARPF_COPYINTERPOLATION)
			{
				// Map both positions of the reference actor to the current portal group
				DVector3 displacedold = old + Displacements.getOffset(reference->PrevPortalGroup, caller->Sector->PortalGroup);
				DVector3 displacedref = old + Displacements.getOffset(reference->Sector->PortalGroup, caller->Sector->PortalGroup);
				caller->Prev = caller->Pos() + displacedold - displacedref;
				caller->PrevPortalGroup = caller->Sector->PortalGroup;
			}
			else if (!(flags & WARPF_INTERPOLATE))
			{
				caller->ClearInterpolation();
			}

			if ((flags & WARPF_BOB) && (reference->flags2 & MF2_FLOATBOB))
			{
				caller->AddZ(reference->GetBobOffset());
			}
			P_TryMove(caller, caller->Pos(), false);
		}
		return true;
	}
	caller->SetOrigin(old, true);
	return false;
}